

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void lyd_wd_update_parents(lyd_node *node)

{
  lyd_node *plVar1;
  lys_node *plVar2;
  long lVar3;
  lyd_node *plVar4;
  
  while( true ) {
    plVar1 = node->parent;
    if ((((plVar1 == (lyd_node *)0x0) || ((plVar1->field_0x9 & 1) != 0)) ||
        (plVar2 = plVar1->schema, plVar2->nodetype != LYS_CONTAINER)) ||
       (lVar3._0_2_ = plVar2[1].flags, lVar3._2_1_ = plVar2[1].ext_size,
       lVar3._3_1_ = plVar2[1].iffeature_size, lVar3._4_1_ = plVar2[1].padding[0],
       lVar3._5_1_ = plVar2[1].padding[1], lVar3._6_1_ = plVar2[1].padding[2],
       lVar3._7_1_ = plVar2[1].padding[3], plVar4 = node, lVar3 != 0)) {
      return;
    }
    while (plVar4 = plVar4->prev, plVar4 != node) {
      if ((plVar4->field_0x9 & 1) == 0) {
        return;
      }
    }
    if (node->prev == node) break;
    plVar1->field_0x9 = plVar1->field_0x9 | 1;
    node = plVar1;
  }
  return;
}

Assistant:

static void
lyd_wd_update_parents(struct lyd_node *node)
{
    struct lyd_node *parent = node->parent, *iter;

    for (parent = node->parent; parent; parent = node->parent) {
        if (parent->dflt || parent->schema->nodetype != LYS_CONTAINER ||
                ((struct lys_node_container *)parent->schema)->presence) {
            /* parent is already default and there is nothing to update or
             * it is not a non-presence container -> stop the loop */
            break;
        }
        /* check that there is still some non default sibling */
        for (iter = node->prev; iter != node; iter = iter->prev) {
            if (!iter->dflt) {
                break;
            }
        }
        if (iter == node && node->prev != node) {
            /* all siblings are implicit default nodes, propagate it to the parent */
            node = node->parent;
            node->dflt = 1;
            continue;
        } else {
            /* stop the loop */
            break;
        }
    }
}